

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledevice.cpp
# Opt level: O1

bool __thiscall QFileDevice::seek(QFileDevice *this,qint64 off)

{
  QObjectData *pQVar1;
  QBindingStatus *pQVar2;
  bool bVar3;
  char cVar4;
  FileError FVar5;
  FileError FVar6;
  long in_FS_OFFSET;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QIODevice).super_QObject.d_ptr.d;
  bVar3 = QIODevice::isOpen(&this->super_QIODevice);
  if (bVar3) {
    if (*(char *)&pQVar1[5].parent == '\x01') {
      *(undefined1 *)&pQVar1[5].parent = 0;
      bVar3 = flush((QFileDevice *)pQVar1->q_ptr);
      if (!bVar3) goto LAB_00238b51;
    }
    pQVar2 = pQVar1[4].bindingStorage.bindingStatus;
    cVar4 = (**(code **)((pQVar2->currentlyEvaluatingBinding->alreadyCaptureProperties).
                         super_QVLAStorage<8UL,_8UL,_8LL>.array + 0x10))(pQVar2,off);
    if (cVar4 != '\0') {
      bVar3 = QIODevice::seek(&this->super_QIODevice,off);
      if (bVar3) {
        QFileDevicePrivate::setError
                  ((QFileDevicePrivate *)(this->super_QIODevice).super_QObject.d_ptr.d,NoError);
        bVar3 = true;
        goto LAB_00238b53;
      }
    }
    FVar5 = QAbstractFileEngine::error
                      ((QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
    FVar6 = PositionError;
    if (FVar5 != UnspecifiedError) {
      FVar6 = FVar5;
    }
    QAbstractFileEngine::errorString
              (&local_40,(QAbstractFileEngine *)pQVar1[4].bindingStorage.bindingStatus);
    *(FileError *)((long)&pQVar1[5].q_ptr + 4) = FVar6;
    QString::operator=((QString *)&pQVar1[4].children.d.size,&local_40);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    seek();
  }
LAB_00238b51:
  bVar3 = false;
LAB_00238b53:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileDevice::seek(qint64 off)
{
    Q_D(QFileDevice);
    if (!isOpen()) {
        qWarning("QFileDevice::seek: IODevice is not open");
        return false;
    }

    if (!d->ensureFlushed())
        return false;

    if (!d->fileEngine->seek(off) || !QIODevice::seek(off)) {
        QFileDevice::FileError err = d->fileEngine->error();
        if (err == QFileDevice::UnspecifiedError)
            err = QFileDevice::PositionError;
        d->setError(err, d->fileEngine->errorString());
        return false;
    }
    unsetError();
    return true;
}